

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O2

UChar * __thiscall
icu_63::StringEnumeration::unext(StringEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  char16_t *pcVar3;
  
  iVar2 = (*(this->super_UObject)._vptr_UObject[7])(this,status);
  if (((UnicodeString *)CONCAT44(extraout_var,iVar2) != (UnicodeString *)0x0) &&
     (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    UnicodeString::operator=(&this->unistr,(UnicodeString *)CONCAT44(extraout_var,iVar2));
    if (resultLength != (int32_t *)0x0) {
      sVar1 = (this->unistr).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->unistr).fUnion.fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      *resultLength = iVar2;
    }
    pcVar3 = UnicodeString::getTerminatedBuffer(&this->unistr);
    return pcVar3;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *
StringEnumeration::unext(int32_t *resultLength, UErrorCode &status) {
    const UnicodeString *s=snext(status);
    if(U_SUCCESS(status) && s!=NULL) {
        unistr=*s;
        if(resultLength!=NULL) {
            *resultLength=unistr.length();
        }
        return unistr.getTerminatedBuffer();
    }

    return NULL;
}